

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  ushort uVar1;
  int iVar2;
  rle16_t *prVar3;
  ulong *puVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  int32_t size;
  uint uVar8;
  int iVar9;
  run_container_t *prVar10;
  long lVar11;
  ulong uVar12;
  uint16_t uVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000031;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  
  iVar9 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar10 = (run_container_t *)c;
  if (iVar9 == 1) {
    iVar9 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar9 * 4 + 2 < 0x2000) {
      if (iVar9 < 1) {
        __assert_fail("n_runs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e7d,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      prVar10 = run_container_create_given_capacity(iVar9);
      puVar4 = *(ulong **)((long)c + 8);
      uVar12 = *puVar4;
      lVar11 = 0;
      while( true ) {
        uVar15 = (int)lVar11 * -0x40 & 0xffff;
        for (lVar11 = (long)(int)lVar11; (uVar12 == 0 && (lVar11 < 0x3ff)); lVar11 = lVar11 + 1) {
          uVar12 = puVar4[lVar11 + 1];
          uVar15 = uVar15 - 0x40;
        }
        if (uVar12 == 0) goto LAB_0010a641;
        lVar5 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar12 = uVar12 - 1 | uVar12;
        iVar9 = 0x3f - (int)lVar5;
        for (; (uVar12 == 0xffffffffffffffff && (lVar11 < 0x3ff)); lVar11 = lVar11 + 1) {
          uVar12 = puVar4[lVar11 + 1];
          iVar9 = iVar9 + 0x40;
        }
        if (uVar12 == 0xffffffffffffffff) break;
        lVar6 = 0;
        if (~uVar12 != 0) {
          for (; (~uVar12 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        prVar3 = prVar10->runs;
        iVar2 = prVar10->n_runs;
        prVar3[iVar2].value = (short)lVar5 - (short)uVar15;
        prVar3[iVar2].length = ((uint16_t)iVar9 + (short)lVar6) - 0x40;
        prVar10->n_runs = iVar2 + 1;
        uVar12 = uVar12 + 1 & uVar12;
      }
      prVar3 = prVar10->runs;
      iVar2 = prVar10->n_runs;
      prVar3[iVar2].value = (short)lVar5 - (short)uVar15;
      prVar3[iVar2].length = (uint16_t)iVar9;
      prVar10->n_runs = iVar2 + 1;
LAB_0010a641:
      bitset_container_free((bitset_container_t *)c);
      *typecode_after = '\x03';
    }
    else {
      *typecode_after = '\x01';
    }
  }
  else if (iVar9 == 2) {
    size = array_container_number_of_runs((array_container_t *)c);
    uVar15 = *c;
    if (size * 4 < (int)(uVar15 * 2)) {
      prVar10 = run_container_create_given_capacity(size);
      if ((int)uVar15 < 1) {
        __assert_fail("card > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e5c,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      lVar11 = *(long *)((long)c + 8);
      uVar8 = 0xfffffffe;
      uVar14 = 0xffffffff;
      uVar12 = 0;
      while( true ) {
        uVar13 = (uint16_t)uVar14;
        sVar7 = (short)uVar8;
        if (uVar15 == uVar12) break;
        uVar1 = *(ushort *)(lVar11 + uVar12 * 2);
        uVar16 = (uint)uVar1;
        uVar17 = uVar8 + 1;
        uVar8 = uVar16;
        if ((uVar17 != uVar1) &&
           (bVar18 = uVar14 != 0xffffffff, uVar14 = uVar16, uVar8 = (uint)uVar1, bVar18)) {
          prVar3 = prVar10->runs;
          iVar9 = prVar10->n_runs;
          prVar3[iVar9].value = uVar13;
          prVar3[iVar9].length = sVar7 - uVar13;
          prVar10->n_runs = iVar9 + 1;
          uVar8 = (uint)*(ushort *)(lVar11 + uVar12 * 2);
        }
        uVar12 = uVar12 + 1;
      }
      if ((int)uVar14 < 0) {
        __assert_fail("run_start >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2e66,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)"
                     );
      }
      prVar3 = prVar10->runs;
      iVar9 = prVar10->n_runs;
      prVar3[iVar9].value = uVar13;
      prVar3[iVar9].length = sVar7 - uVar13;
      prVar10->n_runs = iVar9 + 1;
      *typecode_after = '\x03';
      array_container_free((array_container_t *)c);
    }
    else {
      *typecode_after = '\x02';
    }
  }
  else {
    if (iVar9 != 3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2ea6,"container_t *convert_run_optimize(container_t *, uint8_t, uint8_t *)");
    }
    prVar10 = (run_container_t *)
              convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar10 != (run_container_t *)c) {
      container_free(c,'\x03');
    }
  }
  return prVar10;
}

Assistant:

container_t *convert_run_optimize(
    container_t *c, uint8_t typecode_original,
    uint8_t *typecode_after
){
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc = convert_run_to_efficient_container(
                                    CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        int run_count = 0;
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = __builtin_ctzll(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = __builtin_ctzll(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            run_count++;
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        __builtin_unreachable();
        return NULL;
    }
}